

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileImporter.cpp
# Opt level: O3

void __thiscall
Assimp::ObjFileImporter::createMaterials(ObjFileImporter *this,Model *pModel,aiScene *pScene)

{
  int iVar1;
  ai_uint32 aVar2;
  aiString *pInput;
  ulong uVar3;
  aiMaterial **ppaVar4;
  const_iterator cVar5;
  ObjFileImporter *this_00;
  Logger *pLVar6;
  ulong uVar7;
  aiString *pInput_00;
  uint uVar8;
  ObjFileImporter *pOVar9;
  bool bVar10;
  int uvwIndex;
  undefined4 local_70;
  undefined4 local_6c;
  ulong local_68;
  Model *local_60;
  aiScene *local_58;
  ulong local_50;
  _Base_ptr local_48;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
  *local_40;
  ulong local_38;
  
  if (pScene != (aiScene *)0x0) {
    uVar3 = (long)(pModel->m_MaterialLib).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pModel->m_MaterialLib).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    pScene->mNumMaterials = 0;
    if ((pModel->m_MaterialLib).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pModel->m_MaterialLib).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pLVar6 = DefaultLogger::get();
      Logger::debug(pLVar6,"OBJ: no materials specified");
      return;
    }
    uVar7 = uVar3 >> 5;
    ppaVar4 = (aiMaterial **)operator_new__(uVar3 >> 2 & 0x7fffffff8);
    pScene->mMaterials = ppaVar4;
    if ((int)uVar7 == 0) {
      uVar8 = 0;
    }
    else {
      local_40 = &pModel->m_MaterialMap;
      local_48 = &(pModel->m_MaterialMap)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_50 = uVar7 & 0xffffffff;
      uVar3 = 0;
      local_68 = uVar7;
      local_60 = pModel;
      local_58 = pScene;
      do {
        cVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
                ::find(&local_40->_M_t,
                       (pModel->m_MaterialLib).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar3);
        if (local_48 != cVar5._M_node) {
          this_00 = (ObjFileImporter *)operator_new(0x10);
          aiMaterial::aiMaterial((aiMaterial *)this_00);
          pInput = *(aiString **)(cVar5._M_node + 2);
          aiMaterial::AddProperty((aiMaterial *)this_00,pInput,"?mat.name",0,0);
          iVar1 = *(int *)(pInput[0x10].data + 0x44);
          if (iVar1 == 0) {
            local_6c = 9;
          }
          else if (iVar1 == 1) {
            local_6c = 2;
          }
          else if (iVar1 == 2) {
            local_6c = 3;
          }
          else {
            local_6c = 2;
            pLVar6 = DefaultLogger::get();
            Logger::error(pLVar6,"OBJ: unexpected illumination model (0-2 recognized)");
          }
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)this_00,&local_6c,4,"$mat.shadingm",0,0,aiPTI_Integer);
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)this_00,pInput[0x10].data + 0xc,0xc,"$clr.ambient",0,0,
                     aiPTI_Float);
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)this_00,pInput[0x10].data + 0x18,0xc,"$clr.diffuse",0,0,
                     aiPTI_Float);
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)this_00,pInput[0x10].data + 0x24,0xc,"$clr.specular",0,0,
                     aiPTI_Float);
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)this_00,pInput[0x10].data + 0x30,0xc,"$clr.emissive",0,0,
                     aiPTI_Float);
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)this_00,pInput[0x10].data + 0x40,4,"$mat.shininess",0,0,
                     aiPTI_Float);
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)this_00,pInput[0x10].data + 0x3c,4,"$mat.opacity",0,0,aiPTI_Float
                    );
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)this_00,pInput[0x10].data + 0x4c,0xc,"$clr.transparent",0,0,
                     aiPTI_Float);
          aiMaterial::AddBinaryProperty
                    ((aiMaterial *)this_00,pInput[0x10].data + 0x48,4,"$mat.refracti",0,0,
                     aiPTI_Float);
          local_70 = 0;
          if (pInput[1].length != 0) {
            aiMaterial::AddProperty((aiMaterial *)this_00,pInput + 1,"$tex.file",1,0);
            pOVar9 = this_00;
            aiMaterial::AddBinaryProperty
                      ((aiMaterial *)this_00,&local_70,4,"$tex.uvwsrc",1,0,aiPTI_Integer);
            if ((char)pInput[0x10].length == '\x01') {
              addTextureMappingModeProperty(pOVar9,(aiMaterial *)this_00,aiTextureType_DIFFUSE,1,0);
            }
          }
          if (pInput[3].length != 0) {
            aiMaterial::AddProperty((aiMaterial *)this_00,pInput + 3,"$tex.file",3,0);
            pOVar9 = this_00;
            aiMaterial::AddBinaryProperty
                      ((aiMaterial *)this_00,&local_70,4,"$tex.uvwsrc",3,0,aiPTI_Integer);
            if (*(char *)((long)&pInput[0x10].length + 2) == '\x01') {
              addTextureMappingModeProperty(pOVar9,(aiMaterial *)this_00,aiTextureType_AMBIENT,1,0);
            }
          }
          if (pInput[4].length != 0) {
            aiMaterial::AddProperty((aiMaterial *)this_00,pInput + 4,"$tex.file",4,0);
            aiMaterial::AddBinaryProperty
                      ((aiMaterial *)this_00,&local_70,4,"$tex.uvwsrc",4,0,aiPTI_Integer);
          }
          if (pInput[2].length != 0) {
            aiMaterial::AddProperty((aiMaterial *)this_00,pInput + 2,"$tex.file",2,0);
            pOVar9 = this_00;
            aiMaterial::AddBinaryProperty
                      ((aiMaterial *)this_00,&local_70,4,"$tex.uvwsrc",2,0,aiPTI_Integer);
            if (*(char *)((long)&pInput[0x10].length + 1) == '\x01') {
              addTextureMappingModeProperty(pOVar9,(aiMaterial *)this_00,aiTextureType_SPECULAR,1,0)
              ;
            }
          }
          local_38 = uVar3;
          if (pInput[5].length != 0) {
            aiMaterial::AddProperty((aiMaterial *)this_00,pInput + 5,"$tex.file",5,0);
            pOVar9 = this_00;
            aiMaterial::AddBinaryProperty
                      ((aiMaterial *)this_00,&local_70,4,"$tex.uvwsrc",5,0,aiPTI_Integer);
            if (pInput[0x10].data[0] == '\x01') {
              addTextureMappingModeProperty(pOVar9,(aiMaterial *)this_00,aiTextureType_HEIGHT,1,0);
            }
          }
          if (pInput[6].length != 0) {
            aiMaterial::AddProperty((aiMaterial *)this_00,pInput + 6,"$tex.file",6,0);
            pOVar9 = this_00;
            aiMaterial::AddBinaryProperty
                      ((aiMaterial *)this_00,&local_70,4,"$tex.uvwsrc",6,0,aiPTI_Integer);
            if (pInput[0x10].data[1] == '\x01') {
              addTextureMappingModeProperty(pOVar9,(aiMaterial *)this_00,aiTextureType_NORMALS,1,0);
            }
          }
          if (pInput[7].length != 0) {
            pInput_00 = pInput + 7;
            aVar2 = pInput[8].length;
            uVar3 = 0;
            do {
              uVar8 = (uint)uVar3;
              aiMaterial::AddProperty((aiMaterial *)this_00,pInput_00,"$tex.file",0xb,uVar8);
              pOVar9 = this_00;
              aiMaterial::AddBinaryProperty
                        ((aiMaterial *)this_00,&local_70,4,"$tex.uvwsrc",0xb,uVar8,aiPTI_Integer);
              if (*(char *)((long)pInput + (0x4047 - (ulong)(aVar2 == 0))) == '\x01') {
                addTextureMappingModeProperty
                          (pOVar9,(aiMaterial *)this_00,aiTextureType_REFLECTION,1,uVar8);
              }
              if (aVar2 == 0) break;
              pInput_00 = pInput_00 + 1;
              bVar10 = uVar3 < 5;
              uVar3 = uVar3 + 1;
            } while (bVar10);
          }
          if (pInput[0xf].length != 0) {
            aiMaterial::AddProperty((aiMaterial *)this_00,pInput + 0xf,"$tex.file",9,0);
            pOVar9 = this_00;
            aiMaterial::AddBinaryProperty
                      ((aiMaterial *)this_00,&local_70,4,"$tex.uvwsrc",9,0,aiPTI_Integer);
            if (pInput[0x10].data[0xb] == '\x01') {
              addTextureMappingModeProperty
                        (pOVar9,(aiMaterial *)this_00,aiTextureType_DISPLACEMENT,1,0);
            }
          }
          uVar3 = local_38;
          pScene = local_58;
          pModel = local_60;
          if (pInput[0xe].length != 0) {
            aiMaterial::AddProperty((aiMaterial *)this_00,pInput + 0xe,"$tex.file",8,0);
            pOVar9 = this_00;
            aiMaterial::AddBinaryProperty
                      ((aiMaterial *)this_00,&local_70,4,"$tex.uvwsrc",8,0,aiPTI_Integer);
            if (pInput[0x10].data[10] == '\x01') {
              addTextureMappingModeProperty(pOVar9,(aiMaterial *)this_00,aiTextureType_OPACITY,1,0);
            }
          }
          if (pInput[0xd].length != 0) {
            aiMaterial::AddProperty((aiMaterial *)this_00,pInput + 0xd,"$tex.file",7,0);
            pOVar9 = this_00;
            aiMaterial::AddBinaryProperty
                      ((aiMaterial *)this_00,&local_70,4,"$tex.uvwsrc",7,0,aiPTI_Integer);
            if (pInput[0x10].data[9] == '\x01') {
              addTextureMappingModeProperty
                        (pOVar9,(aiMaterial *)this_00,aiTextureType_SHININESS,1,0);
            }
          }
          pScene->mMaterials[pScene->mNumMaterials] = (aiMaterial *)this_00;
          pScene->mNumMaterials = pScene->mNumMaterials + 1;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 != local_50);
      uVar8 = pScene->mNumMaterials;
      uVar7 = local_68;
    }
    if (uVar8 != (uint)uVar7) {
      __assert_fail("pScene->mNumMaterials == numMaterials",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Obj/ObjFileImporter.cpp"
                    ,0x2f9,
                    "void Assimp::ObjFileImporter::createMaterials(const ObjFile::Model *, aiScene *)"
                   );
    }
  }
  return;
}

Assistant:

void ObjFileImporter::createMaterials(const ObjFile::Model* pModel, aiScene* pScene ) {
    if ( NULL == pScene ) {
        return;
    }

    const unsigned int numMaterials = (unsigned int) pModel->m_MaterialLib.size();
    pScene->mNumMaterials = 0;
    if ( pModel->m_MaterialLib.empty() ) {
        ASSIMP_LOG_DEBUG("OBJ: no materials specified");
        return;
    }

    pScene->mMaterials = new aiMaterial*[ numMaterials ];
    for ( unsigned int matIndex = 0; matIndex < numMaterials; matIndex++ )
    {
        // Store material name
        std::map<std::string, ObjFile::Material*>::const_iterator it;
        it = pModel->m_MaterialMap.find( pModel->m_MaterialLib[ matIndex ] );

        // No material found, use the default material
        if ( pModel->m_MaterialMap.end() == it )
            continue;

        aiMaterial* mat = new aiMaterial;
        ObjFile::Material *pCurrentMaterial = (*it).second;
        mat->AddProperty( &pCurrentMaterial->MaterialName, AI_MATKEY_NAME );

        // convert illumination model
        int sm = 0;
        switch (pCurrentMaterial->illumination_model)
        {
        case 0:
            sm = aiShadingMode_NoShading;
            break;
        case 1:
            sm = aiShadingMode_Gouraud;
            break;
        case 2:
            sm = aiShadingMode_Phong;
            break;
        default:
            sm = aiShadingMode_Gouraud;
            ASSIMP_LOG_ERROR("OBJ: unexpected illumination model (0-2 recognized)");
        }

        mat->AddProperty<int>( &sm, 1, AI_MATKEY_SHADING_MODEL);

        // Adding material colors
        mat->AddProperty( &pCurrentMaterial->ambient, 1, AI_MATKEY_COLOR_AMBIENT );
        mat->AddProperty( &pCurrentMaterial->diffuse, 1, AI_MATKEY_COLOR_DIFFUSE );
        mat->AddProperty( &pCurrentMaterial->specular, 1, AI_MATKEY_COLOR_SPECULAR );
        mat->AddProperty( &pCurrentMaterial->emissive, 1, AI_MATKEY_COLOR_EMISSIVE );
        mat->AddProperty( &pCurrentMaterial->shineness, 1, AI_MATKEY_SHININESS );
        mat->AddProperty( &pCurrentMaterial->alpha, 1, AI_MATKEY_OPACITY );
        mat->AddProperty( &pCurrentMaterial->transparent,1,AI_MATKEY_COLOR_TRANSPARENT);

        // Adding refraction index
        mat->AddProperty( &pCurrentMaterial->ior, 1, AI_MATKEY_REFRACTI );

        // Adding textures
        const int uvwIndex = 0;

        if ( 0 != pCurrentMaterial->texture.length )
        {
            mat->AddProperty( &pCurrentMaterial->texture, AI_MATKEY_TEXTURE_DIFFUSE(0));
            mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_DIFFUSE(0) );
            if (pCurrentMaterial->clamp[ObjFile::Material::TextureDiffuseType])
            {
                addTextureMappingModeProperty(mat, aiTextureType_DIFFUSE);
            }
        }

        if ( 0 != pCurrentMaterial->textureAmbient.length )
        {
            mat->AddProperty( &pCurrentMaterial->textureAmbient, AI_MATKEY_TEXTURE_AMBIENT(0));
            mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_AMBIENT(0) );
            if (pCurrentMaterial->clamp[ObjFile::Material::TextureAmbientType])
            {
                addTextureMappingModeProperty(mat, aiTextureType_AMBIENT);
            }
        }

        if ( 0 != pCurrentMaterial->textureEmissive.length )
        {
            mat->AddProperty( &pCurrentMaterial->textureEmissive, AI_MATKEY_TEXTURE_EMISSIVE(0));
            mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_EMISSIVE(0) );
        }

        if ( 0 != pCurrentMaterial->textureSpecular.length )
        {
            mat->AddProperty( &pCurrentMaterial->textureSpecular, AI_MATKEY_TEXTURE_SPECULAR(0));
            mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_SPECULAR(0) );
            if (pCurrentMaterial->clamp[ObjFile::Material::TextureSpecularType])
            {
                addTextureMappingModeProperty(mat, aiTextureType_SPECULAR);
            }
        }

        if ( 0 != pCurrentMaterial->textureBump.length )
        {
            mat->AddProperty( &pCurrentMaterial->textureBump, AI_MATKEY_TEXTURE_HEIGHT(0));
            mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_HEIGHT(0) );
            if (pCurrentMaterial->clamp[ObjFile::Material::TextureBumpType])
            {
                addTextureMappingModeProperty(mat, aiTextureType_HEIGHT);
            }
        }

        if ( 0 != pCurrentMaterial->textureNormal.length )
        {
            mat->AddProperty( &pCurrentMaterial->textureNormal, AI_MATKEY_TEXTURE_NORMALS(0));
            mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_NORMALS(0) );
            if (pCurrentMaterial->clamp[ObjFile::Material::TextureNormalType])
            {
                addTextureMappingModeProperty(mat, aiTextureType_NORMALS);
            }
        }

        if( 0 != pCurrentMaterial->textureReflection[0].length )
        {
            ObjFile::Material::TextureType type = 0 != pCurrentMaterial->textureReflection[1].length ?
                ObjFile::Material::TextureReflectionCubeTopType :
                ObjFile::Material::TextureReflectionSphereType;

            unsigned count = type == ObjFile::Material::TextureReflectionSphereType ? 1 : 6;
            for( unsigned i = 0; i < count; i++ )
            {
                mat->AddProperty(&pCurrentMaterial->textureReflection[i], AI_MATKEY_TEXTURE_REFLECTION(i));
                mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_REFLECTION(i) );

                if(pCurrentMaterial->clamp[type])
                    addTextureMappingModeProperty(mat, aiTextureType_REFLECTION, 1, i);
            }
        }

        if ( 0 != pCurrentMaterial->textureDisp.length )
        {
            mat->AddProperty( &pCurrentMaterial->textureDisp, AI_MATKEY_TEXTURE_DISPLACEMENT(0) );
            mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_DISPLACEMENT(0) );
            if (pCurrentMaterial->clamp[ObjFile::Material::TextureDispType])
            {
                addTextureMappingModeProperty(mat, aiTextureType_DISPLACEMENT);
            }
        }

        if ( 0 != pCurrentMaterial->textureOpacity.length )
        {
            mat->AddProperty( &pCurrentMaterial->textureOpacity, AI_MATKEY_TEXTURE_OPACITY(0));
            mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_OPACITY(0) );
            if (pCurrentMaterial->clamp[ObjFile::Material::TextureOpacityType])
            {
                addTextureMappingModeProperty(mat, aiTextureType_OPACITY);
            }
        }

        if ( 0 != pCurrentMaterial->textureSpecularity.length )
        {
            mat->AddProperty( &pCurrentMaterial->textureSpecularity, AI_MATKEY_TEXTURE_SHININESS(0));
            mat->AddProperty( &uvwIndex, 1, AI_MATKEY_UVWSRC_SHININESS(0) );
            if (pCurrentMaterial->clamp[ObjFile::Material::TextureSpecularityType])
            {
                addTextureMappingModeProperty(mat, aiTextureType_SHININESS);
            }
        }

        // Store material property info in material array in scene
        pScene->mMaterials[ pScene->mNumMaterials ] = mat;
        pScene->mNumMaterials++;
    }

    // Test number of created materials.
    ai_assert( pScene->mNumMaterials == numMaterials );
}